

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_CDL3WHITESOLDIERS_FramePP
          (TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_stack_00000778;
  double *in_stack_00000780;
  double *in_stack_00000788;
  double *in_stack_00000790;
  int in_stack_0000079c;
  int in_stack_000007a0;
  int *in_stack_000007b0;
  int *in_stack_000007b8;
  int *in_stack_000007c0;
  
  TVar1 = TA_CDL3WHITESOLDIERS
                    (in_stack_000007a0,in_stack_0000079c,in_stack_00000790,in_stack_00000788,
                     in_stack_00000780,in_stack_00000778,in_stack_000007b0,in_stack_000007b8,
                     in_stack_000007c0);
  return TVar1;
}

Assistant:

TA_RetCode TA_CDL3WHITESOLDIERS_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CDL3WHITESOLDIERS(
/* Generated */                           startIdx,
/* Generated */                           endIdx,
/* Generated */                           params->in[0].data.inPrice.open, /* inOpen */
/* Generated */                           params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                           params->in[0].data.inPrice.low, /* inLow */
/* Generated */                           params->in[0].data.inPrice.close, /* inClose */
/* Generated */                           outBegIdx, 
/* Generated */                           outNBElement, 
/* Generated */                           params->out[0].data.outInteger /*  outInteger */ );
/* Generated */ }